

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCanon.c
# Opt level: O0

Ivy_Obj_t * Ivy_CanonPair_rec(Ivy_Man_t *p,Ivy_Obj_t *pGhost)

{
  int iVar1;
  Ivy_Type_t Type_00;
  int c;
  Ivy_Init_t IVar2;
  Ivy_Init_t IVar3;
  Ivy_Obj_t *pIVar4;
  Ivy_Obj_t *pObj;
  Ivy_Obj_t *pIVar5;
  Ivy_Obj_t *pIVar6;
  Ivy_Init_t local_64;
  Ivy_Type_t Type;
  int fCompl1;
  int fCompl0;
  Ivy_Init_t Init1;
  Ivy_Init_t Init0;
  Ivy_Init_t Init;
  Ivy_Obj_t *pLat1;
  Ivy_Obj_t *pLat0;
  Ivy_Obj_t *pResult;
  Ivy_Obj_t *pGhost_local;
  Ivy_Man_t *p_local;
  
  iVar1 = Ivy_ObjIsNode(pGhost);
  if (iVar1 == 0) {
    __assert_fail("Ivy_ObjIsNode(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                  ,0x35,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjIsAnd(pGhost);
  if ((iVar1 == 0) &&
     ((iVar1 = Ivy_ObjFaninC0(pGhost), iVar1 != 0 || (iVar1 = Ivy_ObjFaninC1(pGhost), iVar1 != 0))))
  {
    __assert_fail("Ivy_ObjIsAnd(pGhost) || (!Ivy_ObjFaninC0(pGhost) && !Ivy_ObjFaninC1(pGhost))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                  ,0x36,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  iVar1 = Ivy_ObjFaninId0(pGhost);
  if ((iVar1 != 0) && (iVar1 = Ivy_ObjFaninId1(pGhost), iVar1 != 0)) {
    pIVar4 = Ivy_ObjFanin0(pGhost);
    iVar1 = Ivy_ObjIsLatch(pIVar4);
    if (iVar1 != 0) {
      pIVar4 = Ivy_ObjFanin1(pGhost);
      iVar1 = Ivy_ObjIsLatch(pIVar4);
      if (iVar1 != 0) {
        pIVar4 = Ivy_ObjFanin0(pGhost);
        pObj = Ivy_ObjFanin1(pGhost);
        Type_00 = Ivy_ObjType(pGhost);
        iVar1 = Ivy_ObjFaninC0(pGhost);
        c = Ivy_ObjFaninC1(pGhost);
        pIVar5 = Ivy_ObjFanin0(pIVar4);
        pIVar5 = Ivy_NotCond(pIVar5,iVar1);
        pIVar6 = Ivy_ObjFanin0(pObj);
        pIVar6 = Ivy_NotCond(pIVar6,c);
        pIVar5 = Ivy_Oper(p,pIVar5,pIVar6,Type_00);
        IVar2 = Ivy_ObjInit(pIVar4);
        IVar2 = Ivy_InitNotCond(IVar2,iVar1);
        IVar3 = Ivy_ObjInit(pObj);
        IVar3 = Ivy_InitNotCond(IVar3,c);
        if (Type_00 == IVY_AND) {
          local_64 = Ivy_InitAnd(IVar2,IVar3);
        }
        else {
          local_64 = Ivy_InitExor(IVar2,IVar3);
        }
        pIVar4 = Ivy_Latch(p,pIVar5,local_64);
        return pIVar4;
      }
    }
    p_local = (Ivy_Man_t *)Ivy_TableLookup(p,pGhost);
    if (p_local == (Ivy_Man_t *)0x0) {
      p_local = (Ivy_Man_t *)Ivy_ObjCreate(p,pGhost);
    }
    return (Ivy_Obj_t *)p_local;
  }
  __assert_fail("Ivy_ObjFaninId0(pGhost) != 0 && Ivy_ObjFaninId1(pGhost) != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyCanon.c"
                ,0x37,"Ivy_Obj_t *Ivy_CanonPair_rec(Ivy_Man_t *, Ivy_Obj_t *)");
}

Assistant:

Ivy_Obj_t * Ivy_CanonPair_rec( Ivy_Man_t * p, Ivy_Obj_t * pGhost )
{
    Ivy_Obj_t * pResult, * pLat0, * pLat1;
    Ivy_Init_t Init, Init0, Init1;
    int fCompl0, fCompl1;
    Ivy_Type_t Type;
    assert( Ivy_ObjIsNode(pGhost) );
    assert( Ivy_ObjIsAnd(pGhost) || (!Ivy_ObjFaninC0(pGhost) && !Ivy_ObjFaninC1(pGhost)) );
    assert( Ivy_ObjFaninId0(pGhost) != 0 && Ivy_ObjFaninId1(pGhost) != 0 );
    // consider the case when the pair is canonical
    if ( !Ivy_ObjIsLatch(Ivy_ObjFanin0(pGhost)) || !Ivy_ObjIsLatch(Ivy_ObjFanin1(pGhost)) )
    {
        if ( (pResult = Ivy_TableLookup( p, pGhost )) )
            return pResult;
        return Ivy_ObjCreate( p, pGhost );
    }
    /// remember the latches
    pLat0 = Ivy_ObjFanin0(pGhost);
    pLat1 = Ivy_ObjFanin1(pGhost);
    // remember type and compls
    Type = Ivy_ObjType(pGhost);
    fCompl0 = Ivy_ObjFaninC0(pGhost);
    fCompl1 = Ivy_ObjFaninC1(pGhost);
    // call recursively
    pResult = Ivy_Oper( p, Ivy_NotCond(Ivy_ObjFanin0(pLat0), fCompl0), Ivy_NotCond(Ivy_ObjFanin0(pLat1), fCompl1), Type );
    // build latch on top of this
    Init0 = Ivy_InitNotCond( Ivy_ObjInit(pLat0), fCompl0 );
    Init1 = Ivy_InitNotCond( Ivy_ObjInit(pLat1), fCompl1 );
    Init  = (Type == IVY_AND)? Ivy_InitAnd(Init0, Init1) : Ivy_InitExor(Init0, Init1);
    return Ivy_Latch( p, pResult, Init );
}